

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_poll_add(intptr_t fd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int __fd;
  bool bVar4;
  uint32_t local_2c;
  int local_28;
  
  iVar2 = evio_fd[1];
  piVar3 = __errno_location();
  do {
    *piVar3 = 0;
    local_2c = 0x40002011;
    __fd = (int)fd;
    local_28 = __fd;
    iVar1 = epoll_ctl(iVar2,3,__fd,(epoll_event *)&local_2c);
    if (iVar1 == -1) {
      bVar4 = true;
      if (*piVar3 == 2) {
        *piVar3 = 0;
        local_2c = 0x40002011;
        local_28 = __fd;
        iVar1 = epoll_ctl(iVar2,1,__fd,(epoll_event *)&local_2c);
        bVar4 = iVar1 == -1;
      }
    }
    else {
      bVar4 = false;
    }
    iVar1 = evio_fd[2];
  } while (*piVar3 == 4);
  if (!bVar4) {
    do {
      *piVar3 = 0;
      local_2c = 0x40002014;
      local_28 = __fd;
      iVar2 = epoll_ctl(iVar1,3,__fd,(epoll_event *)&local_2c);
      if ((iVar2 == -1) && (*piVar3 == 2)) {
        *piVar3 = 0;
        local_2c = 0x40002014;
        local_28 = __fd;
        epoll_ctl(iVar1,1,__fd,(epoll_event *)&local_2c);
      }
    } while (*piVar3 == 4);
  }
  return;
}

Assistant:

static inline void fio_poll_add(intptr_t fd) {
  if (fio_poll_add2(fd, (EPOLLIN | EPOLLRDHUP | EPOLLHUP | EPOLLONESHOT),
                    evio_fd[1]) == -1)
    return;
  fio_poll_add2(fd, (EPOLLOUT | EPOLLRDHUP | EPOLLHUP | EPOLLONESHOT),
                evio_fd[2]);
  return;
}